

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.c
# Opt level: O0

void Bar_ProgressUpdate_int(Bar_Progress_t *p,int nItemsCur,char *pString)

{
  char *pString_local;
  int nItemsCur_local;
  Bar_Progress_t *p_local;
  
  if ((p != (Bar_Progress_t *)0x0) && (p->nItemsNext <= nItemsCur)) {
    if (nItemsCur < p->nItemsTotal) {
      p->posCur = p->posCur + 7;
      p->nItemsNext =
           (int)((((double)p->posCur + 7.0) * (double)p->nItemsTotal) / (double)p->posTotal);
    }
    else {
      p->posCur = 0x4e;
      p->nItemsNext = 0x7fffffff;
    }
    Bar_ProgressShow(p,pString);
  }
  return;
}

Assistant:

void Bar_ProgressUpdate_int( Bar_Progress_t * p, int nItemsCur, char * pString )
{
    if ( p == NULL ) return;
    if ( nItemsCur < p->nItemsNext )
        return;
    if ( nItemsCur >= p->nItemsTotal )
    {
        p->posCur = 78;
        p->nItemsNext = 0x7FFFFFFF;
    }
    else
    {
        p->posCur += 7;
        p->nItemsNext = (int)((7.0+p->posCur)*p->nItemsTotal/p->posTotal);
    }
    Bar_ProgressShow( p, pString );
}